

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_PutBlockList
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext)

{
  BLOB_RESULT BVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  IOTHUB_CLIENT_RESULT IVar4;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 uVar7;
  undefined8 uVar6;
  uint putBlockListHttpStatus;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (uploadContext == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    uVar6 = 0;
    pcVar5 = "invalid argument uploadContext=%p";
    iVar3 = 0x404;
    IVar4 = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    putBlockListHttpStatus = 0;
    BVar1 = Blob_PutBlockList(uploadContext->blobHttpApiHandle,
                              uploadContext->blobStorageRelativePath,uploadContext->blockIdList,
                              &putBlockListHttpStatus,(BUFFER_HANDLE)0x0);
    if (BVar1 == BLOB_OK) {
      return IOTHUB_CLIENT_OK;
    }
    p_Var2 = xlogging_get_log_function();
    IVar4 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    uVar6 = CONCAT44(uVar7,putBlockListHttpStatus);
    pcVar5 = "Failed sending block ID list to Blob Storage (%u)";
    iVar3 = 0x412;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
            ,"IoTHubClient_LL_UploadToBlob_PutBlockList",iVar3,1,pcVar5,uVar6);
  return IVar4;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_PutBlockList(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext)
{
    IOTHUB_CLIENT_RESULT result;

    if (uploadContext == NULL)
    {
        LogError("invalid argument uploadContext=%p", uploadContext);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        unsigned int putBlockListHttpStatus = 0;

        // Do not PUT BLOCK LIST if result is not success (isSuccess == false)
        // Otherwise we could corrupt a blob with a partial update.
        if (Blob_PutBlockList(
                uploadContext->blobHttpApiHandle,
                uploadContext->blobStorageRelativePath,
                uploadContext->blockIdList, &putBlockListHttpStatus, NULL) != BLOB_OK)
        {
            LogError("Failed sending block ID list to Blob Storage (%u)", putBlockListHttpStatus);
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}